

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scripting.cpp
# Opt level: O0

void __thiscall
scripting_interface::anon_unknown_1::ScriptClass::add_function
          (ScriptClass *this,char *name,SQFUNCTION function)

{
  HSQUIRRELVM v;
  size_t len;
  SQRESULT result;
  HSQOBJECT obj;
  undefined1 local_30 [8];
  ScopedValidateTop top;
  SQFUNCTION function_local;
  char *name_local;
  ScriptClass *this_local;
  
  top._v = (HSQUIRRELVM *)function;
  ScopedValidateTop::ScopedValidateTop((ScopedValidateTop *)local_30,this->_v);
  obj._0_8_ = *(ulong *)&this->_class_object & 0xffffffff;
  obj._unVal.pTable = (this->_class_object)._unVal.pTable;
  sq_pushobject(*this->_v,obj);
  v = *this->_v;
  len = strlen(name);
  sq_pushstring(v,name,len);
  sq_newclosure(*this->_v,(SQFUNCTION)top._v,0);
  result = sq_newslot(*this->_v,-3,0);
  check_return(result);
  sq_pop(*this->_v,1);
  ScopedValidateTop::~ScopedValidateTop((ScopedValidateTop *)local_30);
  return;
}

Assistant:

void add_function(const char * const name, SQFUNCTION function) {
				ScopedValidateTop top(_v);
				sq_pushobject(_v, _class_object);
				sq_pushstring(_v, name, strlen(name));
				sq_newclosure(_v, function, 0);
				check_return(sq_newslot(_v, -3, SQFalse));
				sq_pop(_v, 1);
			}